

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__refill_buffer(stbi__context *s)

{
  int iVar1;
  int n;
  stbi__context *s_local;
  
  iVar1 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
  s->callback_already_read =
       ((int)s->img_buffer - (int)s->img_buffer_original) + s->callback_already_read;
  if (iVar1 == 0) {
    s->read_from_callbacks = 0;
    s->img_buffer = s->buffer_start;
    s->img_buffer_end = s->buffer_start + 1;
    *s->img_buffer = '\0';
  }
  else {
    s->img_buffer = s->buffer_start;
    s->img_buffer_end = s->buffer_start + iVar1;
  }
  return;
}

Assistant:

static void stbi__refill_buffer(stbi__context *s)
{
   int n = (s->io.read)(s->io_user_data,(char*)s->buffer_start,s->buflen);
   s->callback_already_read += (int) (s->img_buffer - s->img_buffer_original);
   if (n == 0) {
      // at end of file, treat same as if from memory, but need to handle case
      // where s->img_buffer isn't pointing to safe memory, e.g. 0-byte file
      s->read_from_callbacks = 0;
      s->img_buffer = s->buffer_start;
      s->img_buffer_end = s->buffer_start+1;
      *s->img_buffer = 0;
   } else {
      s->img_buffer = s->buffer_start;
      s->img_buffer_end = s->buffer_start + n;
   }
}